

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void xmlFormatError(xmlError *err,xmlGenericErrorFunc channel,void *data)

{
  int iVar1;
  uint uVar2;
  xmlErrorLevel xVar3;
  uint uVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *str;
  xmlParserInputPtr pxVar9;
  long lVar10;
  char *pcVar11;
  void *pvVar12;
  ulong uVar13;
  xmlChar buf [150];
  xmlParserInputPtr local_100;
  undefined2 local_c8 [76];
  
  if (channel == (xmlGenericErrorFunc)0x0 || err == (xmlError *)0x0) {
    return;
  }
  iVar1 = err->code;
  if (iVar1 == 0) {
    return;
  }
  uVar2 = err->domain;
  pvVar5 = err->node;
  pvVar12 = (void *)0x0;
  if ((uVar2 < 0x18) && ((0x80013aU >> (uVar2 & 0x1f) & 1) != 0)) {
    pvVar12 = err->ctxt;
  }
  if ((pvVar5 == (void *)0x0) || (uVar2 == 0x11 || *(int *)((long)pvVar5 + 8) != 1)) {
    lVar10 = 0;
  }
  else {
    lVar10 = *(long *)((long)pvVar5 + 0x10);
  }
  xVar3 = err->level;
  str = err->message;
  uVar4 = err->line;
  if ((pvVar12 == (void *)0x0) ||
     (local_100 = *(xmlParserInputPtr *)((long)pvVar12 + 0x38), local_100 == (xmlParserInputPtr)0x0)
     ) {
    if (err->file == (char *)0x0) {
      pxVar9 = (xmlParserInputPtr)0x0;
      if (uVar4 == 0) {
        local_100 = (xmlParserInputPtr)0x0;
        goto LAB_0012f234;
      }
      if (uVar2 < 0x14) {
        local_100 = (xmlParserInputPtr)0x0;
        if ((0xf0012U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_0012f234;
        (*channel)(data,"Entity: line %d: ",(ulong)uVar4);
      }
    }
    else {
      (*channel)(data,"%s:%d: ");
    }
    pxVar9 = (xmlParserInputPtr)0x0;
    local_100 = (xmlParserInputPtr)0x0;
  }
  else {
    pcVar11 = local_100->filename;
    pxVar9 = local_100;
    if (pcVar11 == (char *)0x0) {
      if ((long)*(int *)((long)pvVar12 + 0x40) < 2) {
        local_100 = (xmlParserInputPtr)0x0;
      }
      else {
        pxVar9 = *(xmlParserInputPtr *)
                  (*(long *)((long)pvVar12 + 0x48) + -0x10 +
                  (long)*(int *)((long)pvVar12 + 0x40) * 8);
        pcVar11 = pxVar9->filename;
        if (pcVar11 != (char *)0x0) goto LAB_0012f175;
      }
      if (uVar4 != 0 && uVar2 == 1) {
        (*channel)(data,"Entity: line %d: ",(ulong)(uint)pxVar9->line);
      }
    }
    else {
      local_100 = (xmlParserInputPtr)0x0;
LAB_0012f175:
      (*channel)(data,"%s:%d: ",pcVar11,(ulong)(uint)pxVar9->line);
    }
  }
LAB_0012f234:
  if (lVar10 != 0) {
    (*channel)(data,"element %s: ",lVar10);
  }
  uVar6 = uVar2 - 1;
  if ((uVar6 < 0x1e) && ((0x3e7fbcfdU >> (uVar6 & 0x1f) & 1) != 0)) {
    (*channel)(data,&DAT_001bfb54 + *(int *)(&DAT_001bfb54 + (ulong)uVar6 * 4));
  }
  if (xVar3 < 4) {
    (*channel)(data,&DAT_001bfbcc + *(int *)(&DAT_001bfbcc + (ulong)xVar3 * 4));
  }
  if ((xmlChar *)str == (xmlChar *)0x0) {
    pcVar11 = "%s\n";
    str = "No error message provided";
  }
  else {
    uVar6 = xmlStrlen((xmlChar *)str);
    if (((int)uVar6 < 1) || (((xmlChar *)str)[(ulong)uVar6 - 1] == '\n')) {
      pcVar11 = "%s";
    }
    else {
      pcVar11 = "%s\n";
    }
  }
  (*channel)(data,pcVar11,str);
  if (pvVar12 == (void *)0x0) goto LAB_0012f418;
  if (pxVar9 != (xmlParserInputPtr)0x0) {
    if (pxVar9->buf == (xmlParserInputBufferPtr)0x0) {
      if (iVar1 == 0x51) goto LAB_0012f350;
    }
    else if ((iVar1 == 0x51) && (pxVar9->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
LAB_0012f350:
      if (pxVar9->cur < pxVar9->end) {
        (*channel)(data,"Bytes:");
        for (lVar10 = 0; (lVar10 != 4 && (pxVar9->cur + lVar10 < pxVar9->end)); lVar10 = lVar10 + 1)
        {
          (*channel)(data," 0x%02X",(ulong)pxVar9->cur[lVar10]);
        }
        (*channel)(data,"\n");
      }
    }
  }
  xmlParserPrintFileContextInternal(pxVar9,channel,data);
  if (local_100 != (xmlParserInputPtr)0x0) {
    if (local_100->filename == (char *)0x0) {
      if (uVar4 != 0 && uVar2 == 1) {
        (*channel)(data,"Entity: line %d: \n",(ulong)(uint)local_100->line);
      }
    }
    else {
      (*channel)(data,"%s:%d: \n",local_100->filename,(ulong)(uint)local_100->line);
    }
    xmlParserPrintFileContextInternal(local_100,channel,data);
  }
LAB_0012f418:
  if ((((uVar2 == 0xc) && ((xmlChar *)err->str1 != (xmlChar *)0x0)) &&
      (iVar1 = err->int1, iVar1 < 100)) && (iVar7 = xmlStrlen((xmlChar *)err->str1), iVar1 < iVar7))
  {
    uVar13 = 0;
    (*channel)(data,"%s\n",err->str1);
    uVar8 = (ulong)(uint)err->int1;
    if (err->int1 < 1) {
      uVar8 = uVar13;
    }
    for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      *(undefined1 *)((long)local_c8 + uVar13) = 0x20;
    }
    *(undefined2 *)((long)local_c8 + uVar8) = 0x5e;
    (*channel)(data,"%s\n",local_c8);
  }
  return;
}

Assistant:

void
xmlFormatError(const xmlError *err, xmlGenericErrorFunc channel, void *data)
{
    const char *message;
    const char *file;
    int line;
    int code;
    int domain;
    const xmlChar *name = NULL;
    xmlNodePtr node;
    xmlErrorLevel level;
    xmlParserCtxtPtr ctxt = NULL;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;

    if ((err == NULL) || (channel == NULL))
        return;

    message = err->message;
    file = err->file;
    line = err->line;
    code = err->code;
    domain = err->domain;
    level = err->level;
    node = err->node;

    if (code == XML_ERR_OK)
        return;

    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = err->ctxt;
    }

    if ((node != NULL) && (node->type == XML_ELEMENT_NODE) &&
        (domain != XML_FROM_SCHEMASV))
        name = node->name;

    /*
     * Maintain the compatibility with the legacy error handling
     */
    if ((ctxt != NULL) && (ctxt->input != NULL)) {
        input = ctxt->input;
        if ((input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            cur = input;
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        if (input->filename)
            channel(data, "%s:%d: ", input->filename, input->line);
        else if ((line != 0) && (domain == XML_FROM_PARSER))
            channel(data, "Entity: line %d: ", input->line);
    } else {
        if (file != NULL)
            channel(data, "%s:%d: ", file, line);
        else if ((line != 0) &&
	         ((domain == XML_FROM_PARSER) || (domain == XML_FROM_SCHEMASV)||
		  (domain == XML_FROM_SCHEMASP)||(domain == XML_FROM_DTD) ||
		  (domain == XML_FROM_RELAXNGP)||(domain == XML_FROM_RELAXNGV)))
            channel(data, "Entity: line %d: ", line);
    }
    if (name != NULL) {
        channel(data, "element %s: ", name);
    }
    switch (domain) {
        case XML_FROM_PARSER:
            channel(data, "parser ");
            break;
        case XML_FROM_NAMESPACE:
            channel(data, "namespace ");
            break;
        case XML_FROM_DTD:
        case XML_FROM_VALID:
            channel(data, "validity ");
            break;
        case XML_FROM_HTML:
            channel(data, "HTML parser ");
            break;
        case XML_FROM_MEMORY:
            channel(data, "memory ");
            break;
        case XML_FROM_OUTPUT:
            channel(data, "output ");
            break;
        case XML_FROM_IO:
            channel(data, "I/O ");
            break;
        case XML_FROM_XINCLUDE:
            channel(data, "XInclude ");
            break;
        case XML_FROM_XPATH:
            channel(data, "XPath ");
            break;
        case XML_FROM_XPOINTER:
            channel(data, "parser ");
            break;
        case XML_FROM_REGEXP:
            channel(data, "regexp ");
            break;
        case XML_FROM_MODULE:
            channel(data, "module ");
            break;
        case XML_FROM_SCHEMASV:
            channel(data, "Schemas validity ");
            break;
        case XML_FROM_SCHEMASP:
            channel(data, "Schemas parser ");
            break;
        case XML_FROM_RELAXNGP:
            channel(data, "Relax-NG parser ");
            break;
        case XML_FROM_RELAXNGV:
            channel(data, "Relax-NG validity ");
            break;
        case XML_FROM_CATALOG:
            channel(data, "Catalog ");
            break;
        case XML_FROM_C14N:
            channel(data, "C14N ");
            break;
        case XML_FROM_XSLT:
            channel(data, "XSLT ");
            break;
        case XML_FROM_I18N:
            channel(data, "encoding ");
            break;
        case XML_FROM_SCHEMATRONV:
            channel(data, "schematron ");
            break;
        case XML_FROM_BUFFER:
            channel(data, "internal buffer ");
            break;
        case XML_FROM_URI:
            channel(data, "URI ");
            break;
        default:
            break;
    }
    switch (level) {
        case XML_ERR_NONE:
            channel(data, ": ");
            break;
        case XML_ERR_WARNING:
            channel(data, "warning : ");
            break;
        case XML_ERR_ERROR:
            channel(data, "error : ");
            break;
        case XML_ERR_FATAL:
            channel(data, "error : ");
            break;
    }
    if (message != NULL) {
        int len;
	len = xmlStrlen((const xmlChar *) message);
	if ((len > 0) && (message[len - 1] != '\n'))
	    channel(data, "%s\n", message);
	else
	    channel(data, "%s", message);
    } else {
        channel(data, "%s\n", "No error message provided");
    }

    if (ctxt != NULL) {
        if ((input != NULL) &&
            ((input->buf == NULL) || (input->buf->encoder == NULL)) &&
            (code == XML_ERR_INVALID_ENCODING) &&
            (input->cur < input->end)) {
            int i;

            channel(data, "Bytes:");
            for (i = 0; i < 4; i++) {
                if (input->cur + i >= input->end)
                    break;
                channel(data, " 0x%02X", input->cur[i]);
            }
            channel(data, "\n");
        }

        xmlParserPrintFileContextInternal(input, channel, data);

        if (cur != NULL) {
            if (cur->filename)
                channel(data, "%s:%d: \n", cur->filename, cur->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: \n", cur->line);
            xmlParserPrintFileContextInternal(cur, channel, data);
        }
    }
    if ((domain == XML_FROM_XPATH) && (err->str1 != NULL) &&
        (err->int1 < 100) &&
	(err->int1 < xmlStrlen((const xmlChar *)err->str1))) {
	xmlChar buf[150];
	int i;

	channel(data, "%s\n", err->str1);
	for (i=0;i < err->int1;i++)
	     buf[i] = ' ';
	buf[i++] = '^';
	buf[i] = 0;
	channel(data, "%s\n", buf);
    }
}